

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

Sign anon_unknown.dwarf_775ed::side4h_3d_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *p4,double h0,double h1,double h2
               ,double h3,double h4,bool sos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  index_t iVar4;
  index_t iVar5;
  index_t iVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  uint uVar10;
  Sign SVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  expansion *this;
  expansion *this_00;
  expansion *this_01;
  expansion *peVar15;
  expansion *this_02;
  expansion *this_03;
  long lVar16;
  int iVar17;
  expansion *this_04;
  expansion *peVar18;
  ulong uVar19;
  double dVar20;
  double dStackY_920;
  expansion local_8f8 [64];
  expansion local_2e8;
  expansion local_2c8;
  expansion local_2a8;
  expansion local_288;
  expansion local_268;
  expansion local_248;
  expansion local_228;
  expansion local_208;
  expansion local_1e8;
  expansion local_1c8;
  string local_1a8;
  expansion local_188;
  expansion local_168;
  expansion local_148;
  expansion local_128;
  expansion local_108;
  expansion local_e8;
  undefined1 local_c8 [8];
  double *p_sort [5];
  
  local_228.capacity_ = 2;
  dVar20 = *p1;
  dVar1 = *p0;
  local_228.length_ = 2;
  local_228.x_[1] = dVar20 - dVar1;
  local_228.x_[0] =
       (dVar20 - (local_228.x_[1] + (dVar20 - local_228.x_[1]))) +
       ((dVar20 - local_228.x_[1]) - dVar1);
  local_208.capacity_ = 2;
  dVar20 = p1[1];
  dVar2 = p0[1];
  local_208.length_ = 2;
  local_208.x_[1] = dVar20 - dVar2;
  local_208.x_[0] =
       (dVar20 - (local_208.x_[1] + (dVar20 - local_208.x_[1]))) +
       ((dVar20 - local_208.x_[1]) - dVar2);
  local_188.capacity_ = 2;
  dVar20 = p1[2];
  dVar3 = p0[2];
  local_188.length_ = 2;
  local_188.x_[1] = dVar20 - dVar3;
  local_188.x_[0] =
       (dVar20 - (local_188.x_[1] + (dVar20 - local_188.x_[1]))) +
       ((dVar20 - local_188.x_[1]) - dVar3);
  local_168.length_ = 2;
  local_168.capacity_ = 2;
  local_168.x_[1] = h0 - h1;
  local_168.x_[0] =
       (h0 - (local_168.x_[1] + (h0 - local_168.x_[1]))) + ((h0 - local_168.x_[1]) - h1);
  local_1e8.capacity_ = 2;
  dVar20 = *p2;
  local_1e8.length_ = 2;
  local_1e8.x_[1] = dVar20 - dVar1;
  local_1e8.x_[0] =
       (dVar20 - (local_1e8.x_[1] + (dVar20 - local_1e8.x_[1]))) +
       ((dVar20 - local_1e8.x_[1]) - dVar1);
  local_1c8.capacity_ = 2;
  dVar20 = p2[1];
  local_1c8.length_ = 2;
  local_1c8.x_[1] = dVar20 - dVar2;
  local_1c8.x_[0] =
       (dVar20 - (local_1c8.x_[1] + (dVar20 - local_1c8.x_[1]))) +
       ((dVar20 - local_1c8.x_[1]) - dVar2);
  local_2c8.capacity_ = 2;
  dVar20 = p2[2];
  local_2c8.length_ = 2;
  local_2c8.x_[1] = dVar20 - dVar3;
  local_2c8.x_[0] =
       (dVar20 - (local_2c8.x_[1] + (dVar20 - local_2c8.x_[1]))) +
       ((dVar20 - local_2c8.x_[1]) - dVar3);
  local_148.length_ = 2;
  local_148.capacity_ = 2;
  local_148.x_[1] = h0 - h2;
  local_148.x_[0] =
       (h0 - (local_148.x_[1] + (h0 - local_148.x_[1]))) + ((h0 - local_148.x_[1]) - h2);
  local_128.capacity_ = 2;
  dVar20 = *p3;
  local_128.length_ = 2;
  local_128.x_[1] = dVar20 - dVar1;
  local_128.x_[0] =
       (dVar20 - (local_128.x_[1] + (dVar20 - local_128.x_[1]))) +
       ((dVar20 - local_128.x_[1]) - dVar1);
  local_2a8.capacity_ = 2;
  dVar20 = p3[1];
  local_2a8.length_ = 2;
  local_2a8.x_[1] = dVar20 - dVar2;
  local_2a8.x_[0] =
       (dVar20 - (local_2a8.x_[1] + (dVar20 - local_2a8.x_[1]))) +
       ((dVar20 - local_2a8.x_[1]) - dVar2);
  local_288.capacity_ = 2;
  dVar20 = p3[2];
  local_288.length_ = 2;
  local_288.x_[1] = dVar20 - dVar3;
  local_288.x_[0] =
       (dVar20 - (local_288.x_[1] + (dVar20 - local_288.x_[1]))) +
       ((dVar20 - local_288.x_[1]) - dVar3);
  local_108.length_ = 2;
  local_108.capacity_ = 2;
  local_108.x_[1] = h0 - h3;
  local_108.x_[0] =
       (h0 - (local_108.x_[1] + (h0 - local_108.x_[1]))) + ((h0 - local_108.x_[1]) - h3);
  local_2e8.capacity_ = 2;
  dVar20 = *p4;
  local_2e8.length_ = 2;
  local_2e8.x_[1] = dVar20 - dVar1;
  local_2e8.x_[0] =
       (dVar20 - (local_2e8.x_[1] + (dVar20 - local_2e8.x_[1]))) +
       ((dVar20 - local_2e8.x_[1]) - dVar1);
  local_268.capacity_ = 2;
  dVar20 = p4[1];
  local_268.length_ = 2;
  local_268.x_[1] = dVar20 - dVar2;
  local_268.x_[0] =
       (dVar20 - (local_268.x_[1] + (dVar20 - local_268.x_[1]))) +
       ((dVar20 - local_268.x_[1]) - dVar2);
  local_248.capacity_ = 2;
  dVar20 = p4[2];
  local_248.length_ = 2;
  local_e8.length_ = 2;
  local_e8.capacity_ = 2;
  local_8f8[0].length_ = 0;
  local_8f8[0].capacity_ = 0xc0;
  local_248.x_[1] = dVar20 - dVar3;
  local_248.x_[0] =
       (dVar20 - (local_248.x_[1] + (dVar20 - local_248.x_[1]))) +
       ((dVar20 - local_248.x_[1]) - dVar3);
  local_e8.x_[1] = h0 - h4;
  local_e8.x_[0] = (h0 - (local_e8.x_[1] + (h0 - local_e8.x_[1]))) + ((h0 - local_e8.x_[1]) - h4);
  dStackY_920 = 6.72533026563313e-318;
  GEO::expansion::assign_det3x3
            (local_8f8,&local_1e8,&local_1c8,&local_2c8,&local_128,&local_2a8,&local_288,&local_2e8,
             &local_268,&local_248);
  uVar10 = ((local_268.length_ + local_248.length_) * local_128.length_ +
            local_288.length_ * local_268.length_ + local_248.length_ * local_2a8.length_ +
           (local_288.length_ + local_2a8.length_) * local_2e8.length_) * 8;
  uVar14 = (ulong)uVar10 * 8 + 0x10 & 0x7ffffffd0;
  lVar9 = -uVar14;
  this = (expansion *)((long)local_8f8 + lVar9);
  *(undefined4 *)((long)local_8f8 - uVar14) = 0;
  *(uint *)((long)local_8f8 + lVar9 + 4) = uVar10;
  *(expansion **)((long)local_8f8 + lVar9 + -8) = &local_248;
  *(expansion **)((long)local_8f8 + lVar9 + -0x10) = &local_268;
  *(expansion **)((long)local_8f8 + lVar9 + -0x18) = &local_2e8;
  *(expansion **)(&stack0xfffffffffffff6e8 + lVar9) = &local_288;
  *(undefined8 *)((long)&dStackY_920 + lVar9) = 0x14c5e2;
  GEO::expansion::assign_det3x3
            (this,&local_228,&local_208,&local_188,&local_128,&local_2a8,
             *(expansion **)(&stack0xfffffffffffff6e8 + lVar9),
             *(expansion **)((long)local_8f8 + lVar9 + -0x18),
             *(expansion **)((long)local_8f8 + lVar9 + -0x10),
             *(expansion **)((long)local_8f8 + lVar9 + -8));
  uVar10 = ((local_2e8.length_ * local_1c8.length_ + local_1e8.length_ * local_268.length_) *
            local_188.length_ +
           (local_2c8.length_ * local_2e8.length_ + local_248.length_ * local_1e8.length_) *
           local_208.length_ +
           (local_2c8.length_ * local_268.length_ + local_248.length_ * local_1c8.length_) *
           local_228.length_) * 4;
  uVar14 = (ulong)uVar10 * 8 + 0x10 & 0x7fffffff0;
  this_00 = (expansion *)((long)local_8f8 + (lVar9 - uVar14));
  *(undefined4 *)((long)local_8f8 + (lVar9 - uVar14)) = 0;
  this_00->capacity_ = uVar10;
  this_00[-1].x_[1] = (double)&local_248;
  this_00[-1].x_[0] = (double)&local_268;
  *(expansion **)(this_00 + -1) = &local_2e8;
  this_00[-2].x_[1] = (double)&local_2c8;
  this_00[-2].x_[0] = 6.72706443605004e-318;
  GEO::expansion::assign_det3x3
            (this_00,&local_228,&local_208,&local_188,&local_1e8,&local_1c8,
             (expansion *)this_00[-2].x_[1],*(expansion **)(this_00 + -1),
             (expansion *)this_00[-1].x_[0],(expansion *)this_00[-1].x_[1]);
  uVar10 = ((local_128.length_ * local_1c8.length_ + local_1e8.length_ * local_2a8.length_) *
            local_188.length_ +
           (local_2c8.length_ * local_128.length_ + local_288.length_ * local_1e8.length_) *
           local_208.length_ +
           (local_2c8.length_ * local_2a8.length_ + local_288.length_ * local_1c8.length_) *
           local_228.length_) * 4;
  uVar14 = (ulong)uVar10 * 8 + 0x10 & 0x7fffffff0;
  this_01 = (expansion *)((long)this_00 - uVar14);
  this_01->length_ = 0;
  this_01->capacity_ = uVar10;
  this_01[-1].x_[1] = (double)&local_288;
  this_01[-1].x_[0] = (double)&local_2a8;
  *(expansion **)(this_01 + -1) = &local_128;
  this_01[-2].x_[1] = (double)&local_2c8;
  this_01[-2].x_[0] = 6.72797845749484e-318;
  GEO::expansion::assign_det3x3
            (this_01,&local_228,&local_208,&local_188,&local_1e8,&local_1c8,
             (expansion *)this_01[-2].x_[1],*(expansion **)(this_01 + -1),
             (expansion *)this_01[-1].x_[0],(expansion *)this_01[-1].x_[1]);
  iVar17 = *(int *)((long)this_00 - uVar14);
  if (iVar17 != 0) {
    SVar11 = POSITIVE;
    if ((0.0 < this_01->x_[iVar17 - 1]) || (SVar11 = NEGATIVE, this_01->x_[iVar17 - 1] < 0.0)) {
      uVar10 = local_8f8[0].length_ << 2;
      uVar14 = (ulong)uVar10 * 8 + 0x10 & 0x7fffffff0;
      peVar15 = (expansion *)((long)this_01 - uVar14);
      *(undefined4 *)((long)this_01 - uVar14) = 0;
      peVar15->capacity_ = uVar10;
      peVar15[-1].x_[1] = 6.72866520874256e-318;
      GEO::expansion::assign_product(peVar15,local_8f8,&local_168);
      uVar10 = this->length_ << 2;
      uVar14 = (ulong)uVar10 * 8 + 0x10 & 0x7fffffff0;
      peVar18 = (expansion *)((long)peVar15 - uVar14);
      peVar18->length_ = 0;
      peVar18->capacity_ = uVar10;
      peVar18[-1].x_[1] = 6.72894682616069e-318;
      GEO::expansion::assign_product(peVar18,this,&local_148);
      uVar10 = *(uint *)((long)peVar15 - uVar14);
      if ((ulong)uVar10 != 0) {
        uVar14 = 0;
        do {
          peVar18->x_[uVar14] = -peVar18->x_[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
      }
      uVar12 = this_00->length_ << 2;
      uVar14 = (ulong)uVar12 * 8 + 0x10 & 0x7fffffff0;
      this_02 = (expansion *)((long)peVar18 - uVar14);
      *(undefined4 *)((long)peVar18 - uVar14) = 0;
      this_02->capacity_ = uVar12;
      this_02[-1].x_[1] = 6.72951994230987e-318;
      GEO::expansion::assign_product(this_02,this_00,&local_108);
      uVar14 = (ulong)(uint)(iVar17 << 2) * 8 + 0x10 & 0x7fffffff0;
      this_04 = (expansion *)((long)this_02 - uVar14);
      this_04->length_ = 0;
      this_04->capacity_ = iVar17 << 2;
      this_04[-1].x_[1] = 6.72982132235383e-318;
      GEO::expansion::assign_product(this_04,this_01,&local_e8);
      uVar12 = *(uint *)((long)this_02 - uVar14);
      if ((ulong)uVar12 != 0) {
        uVar14 = 0;
        do {
          this_04->x_[uVar14] = -this_04->x_[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      iVar4 = this_02->length_;
      iVar17 = uVar10 + uVar12 + peVar15->length_;
      uVar14 = (ulong)(iVar4 + iVar17 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
      this_03 = (expansion *)((long)this_04 - uVar14);
      this_03->length_ = 0;
      this_03->capacity_ = iVar4 + iVar17;
      this_03[-1].x_[1] = 6.73043396375467e-318;
      GEO::expansion::assign_sum(this_03,peVar15,peVar18,this_02,this_04);
      iVar17 = *(int *)((long)this_04 - uVar14);
      if (iVar17 == 0) {
        iVar13 = 0;
      }
      else {
        iVar13 = 1;
        if (this_03->x_[iVar17 - 1] <= 0.0) {
          iVar13 = -(uint)(this_03->x_[iVar17 - 1] < 0.0);
        }
      }
      if (sos && iVar13 == 0) {
        local_c8 = (undefined1  [8])p0;
        p_sort[0] = p1;
        p_sort[1] = p2;
        p_sort[2] = p3;
        p_sort[3] = p4;
        this_03[-1].x_[1] = 6.73113059631531e-318;
        SOS_sort((double **)local_c8,p_sort + 4,3);
        iVar4 = local_8f8[0].length_;
        p_sort[4] = (double *)(ulong)(local_8f8[0].length_ - 1);
        lVar16 = 0;
        do {
          pdVar8 = p_sort[lVar16 + -1];
          if (pdVar8 == p0) {
            iVar5 = this->length_;
            uVar19 = (ulong)(iVar5 + iVar4 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
            peVar15 = (expansion *)((long)this_03 - uVar19);
            peVar15->length_ = 0;
            peVar15->capacity_ = iVar4 + iVar5;
            peVar15[-1].x_[1] = 6.73192110134866e-318;
            GEO::expansion::assign_diff(peVar15,this,local_8f8);
            iVar5 = this_01->length_;
            iVar6 = this_00->length_;
            uVar14 = (ulong)(iVar5 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
            peVar18 = (expansion *)((long)peVar15 - uVar14);
            peVar18->length_ = 0;
            peVar18->capacity_ = iVar6 + iVar5;
            peVar18[-1].x_[1] = 6.73223730336199e-318;
            GEO::expansion::assign_diff(peVar18,this_01,this_00);
            iVar17 = *(int *)((long)this_03 - uVar19);
            iVar7 = *(int *)((long)peVar15 - uVar14);
            uVar14 = (ulong)(iVar17 + iVar7 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
            this_03 = (expansion *)((long)peVar18 - uVar14);
            this_03->length_ = 0;
            this_03->capacity_ = iVar7 + iVar17;
            this_03[-1].x_[1] = 6.73262267456575e-318;
            GEO::expansion::assign_sum(this_03,peVar15,peVar18);
            iVar17 = *(int *)((long)peVar18 - uVar14);
            if (iVar17 != 0) {
              dVar20 = this_03->x_[iVar17 - 1];
LAB_0014cb77:
              if (0.0 < dVar20) {
                return SVar11;
              }
              if (dVar20 < 0.0) {
LAB_0014cbad:
                return -SVar11;
              }
            }
          }
          else if (pdVar8 == p1) {
            if (iVar4 != 0) {
              dVar20 = local_8f8[0].x_[(long)p_sort[4]];
              goto LAB_0014cb77;
            }
          }
          else if (pdVar8 == p2) {
            if (this->length_ != 0) {
              dVar20 = *(double *)((long)local_8f8 + (ulong)(this->length_ - 1) * 8 + lVar9 + 8);
              if (0.0 < dVar20) goto LAB_0014cbad;
              if (dVar20 < 0.0) {
                return SVar11;
              }
            }
          }
          else if (pdVar8 == p3) {
            if (this_00->length_ != 0) {
              dVar20 = this_00->x_[this_00->length_ - 1];
              goto LAB_0014cb77;
            }
          }
          else if (pdVar8 == p4) {
            return NEGATIVE;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 5);
      }
      return SVar11 * iVar13;
    }
  }
  local_c8 = (undefined1  [8])(p_sort + 1);
  this_01[-1].x_[1] = 6.73367997504785e-318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Delta4_sign != ZERO","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  this_01[-1].x_[1] = 6.73386277933681e-318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,"");
  this_01[-1].x_[1] = (double)&LAB_0014cc1d;
  GEO::geo_assertion_failed((string *)local_c8,&local_1a8,0x5007);
}

Assistant:

Sign side4h_3d_exact_SOS(
        const double* p0, const double* p1,
        const double* p2, const double* p3, const double* p4,
        double h0, double h1, double h2, double h3, double h4,
        bool sos = true
    ) {
        PCK_STAT(cnt_orient3dh_exact++);

        const expansion& a11 = expansion_diff(p1[0], p0[0]);
        const expansion& a12 = expansion_diff(p1[1], p0[1]);
        const expansion& a13 = expansion_diff(p1[2], p0[2]);
        const expansion& a14 = expansion_diff(h0,h1);

        const expansion& a21 = expansion_diff(p2[0], p0[0]);
        const expansion& a22 = expansion_diff(p2[1], p0[1]);
        const expansion& a23 = expansion_diff(p2[2], p0[2]);
        const expansion& a24 = expansion_diff(h0,h2);

        const expansion& a31 = expansion_diff(p3[0], p0[0]);
        const expansion& a32 = expansion_diff(p3[1], p0[1]);
        const expansion& a33 = expansion_diff(p3[2], p0[2]);
        const expansion& a34 = expansion_diff(h0,h3);

        const expansion& a41 = expansion_diff(p4[0], p0[0]);
        const expansion& a42 = expansion_diff(p4[1], p0[1]);
        const expansion& a43 = expansion_diff(p4[2], p0[2]);
        const expansion& a44 = expansion_diff(h0,h4);

        // Note: we could probably reuse some of the 2x2 co-factors
        // (but for now I'd rather keep this form that is easier to
        //  read ... and to debug if need be !)
        const expansion& Delta1 = expansion_det3x3(
            a21, a22, a23,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta2 = expansion_det3x3(
            a11, a12, a13,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta3 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a41, a42, a43
        );
        const expansion& Delta4 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a31, a32, a33
        );

        Sign Delta4_sign = Delta4.sign();
        geo_assert(Delta4_sign != ZERO);

        const expansion& r_1 = expansion_product(Delta1, a14);
        const expansion& r_2 = expansion_product(Delta2, a24).negate();
        const expansion& r_3 = expansion_product(Delta3, a34);
        const expansion& r_4 = expansion_product(Delta4, a44).negate();
        const expansion& r = expansion_sum4(r_1, r_2, r_3, r_4);

        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_orient3dh_num = std::max(len_orient3dh_num, r.length()));
        PCK_STAT(len_orient3dh_denom = std::max(len_orient3dh_denom, Delta1.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(sos && r_sign == ZERO) {
            PCK_STAT(cnt_orient3dh_SOS++);
            const double* p_sort[5];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            p_sort[4] = p4;

	    SOS_sort(p_sort, p_sort + 5, 3);
            for(index_t i = 0; i < 5; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1 = expansion_diff(Delta2, Delta1);
                    const expansion& z2 = expansion_diff(Delta4, Delta3);
                    const expansion& z = expansion_sum(z1, z2);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta4_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    Sign Delta1_sign = Delta1.sign();
                    if(Delta1_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta1.length()));
                        return Sign(Delta4_sign * Delta1_sign);
                    }
                } else if(p_sort[i] == p2) {
                    Sign Delta2_sign = Delta2.sign();
                    if(Delta2_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta2.length()));
                        return Sign(-Delta4_sign * Delta2_sign);
                    }
                } else if(p_sort[i] == p3) {
                    Sign Delta3_sign = Delta3.sign();
                    if(Delta3_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta3.length()));
                        return Sign(Delta4_sign * Delta3_sign);
                    }
                } else if(p_sort[i] == p4) {
                    return NEGATIVE;
                }
            }
        }
        return Sign(Delta4_sign * r_sign);
    }